

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

void __thiscall
CVmObjDate::restore_from_file(CVmObjDate *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *param_3)

{
  vm_date_ext *pvVar1;
  long lVar2;
  ulong uVar3;
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  pvVar1 = vm_date_ext::alloc_ext(this);
  (this->super_CVmObject).ext_ = (char *)pvVar1;
  lVar2 = CVmFile::read_int4(fp);
  pvVar1->dayno = (int32_t)lVar2;
  uVar3 = CVmFile::read_uint4(fp);
  pvVar1->daytime = (int32_t)uVar3;
  return;
}

Assistant:

void CVmObjDate::restore_from_file(VMG_ vm_obj_id_t self,
                                   CVmFile *fp, CVmObjFixup *)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* allocate the extension structure */
    vm_date_ext *ext = vm_date_ext::alloc_ext(vmg_ this);
    ext_ = (char *)ext;

    /* read the data */
    ext->dayno = fp->read_int4();
    ext->daytime = fp->read_uint4();
}